

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<int>::set_size(RepeatedField<int> *this,bool is_soo,int size)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  uint extraout_EDX;
  ulong uVar4;
  undefined7 in_register_00000031;
  ulong *puVar5;
  undefined8 *puVar6;
  undefined8 auStack_50 [2];
  ulong uStack_40;
  RepeatedField<int> *pRStack_38;
  code *pcStack_30;
  ulong auStack_28 [2];
  
  puVar5 = auStack_28;
  uVar4 = CONCAT71(in_register_00000031,is_soo) & 0xffffffff;
  iVar2 = 2;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar2 < size) {
    pcStack_30 = (code *)0x1a7fed;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)size,(long)iVar2,"size <= Capacity(is_soo)");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    internal::SooRep::set_size(&this->soo_rep_,SUB81(uVar4,0),size);
    return;
  }
  pcStack_30 = internal::SooRep::set_size;
  set_size();
  puVar6 = auStack_50;
  bVar1 = SUB81(psVar3,0);
  uStack_40 = (ulong)(uint)size;
  pRStack_38 = this;
  pcStack_30 = (code *)uVar4;
  if (((*puVar5 & 4) == 0) == bVar1) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar1,(*puVar5 & 4) == 0,"is_soo == this->is_soo()");
  }
  if (psVar3 == (string *)0x0) {
    if (bVar1 == false) {
      *(uint *)(puVar5 + 1) = extraout_EDX;
    }
    else {
      if ((int)extraout_EDX < 4) {
        psVar3 = (string *)0x0;
      }
      else {
        psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((ulong)extraout_EDX,3,"size <= kSooSizeMask");
      }
      if (psVar3 != (string *)0x0) goto LAB_001a8087;
      *puVar5 = (long)(int)extraout_EDX | *puVar5 & 0xfffffffffffffff8;
    }
    return;
  }
  internal::SooRep::set_size();
LAB_001a8087:
  internal::SooRep::set_size();
  *puVar6 = &PTR___cxa_pure_virtual_0051c118;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(puVar6 + 4));
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }